

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# audit_regressor.cc
# Opt level: O0

void audit_regressor_feature(audit_regressor_data *dat,float param_2,uint64_t ft_idx)

{
  bool bVar1;
  uint32_t uVar2;
  weight *pwVar3;
  reference pbVar4;
  ostream *poVar5;
  uint64_t uVar6;
  ulong __val;
  ulong in_RSI;
  long *in_RDI;
  string temp;
  ostringstream tempstream;
  const_iterator s;
  string ns_pre;
  parameters *weights;
  parameters *in_stack_fffffffffffffcf8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd00;
  parameters *in_stack_fffffffffffffd08;
  parameters *this;
  io_buf *this_00;
  string local_2a0 [32];
  string local_280 [32];
  string local_260 [32];
  string local_240 [32];
  string local_220 [32];
  undefined1 local_200 [32];
  ostream local_1e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_50;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_48;
  string local_40 [32];
  long local_20;
  ulong local_18;
  long *local_8;
  
  local_20 = *in_RDI + 0x3590;
  local_18 = in_RSI;
  local_8 = in_RDI;
  pwVar3 = parameters::operator[](in_stack_fffffffffffffd08,(size_t)in_stack_fffffffffffffd00);
  if ((*pwVar3 != 0.0) || (NAN(*pwVar3))) {
    local_8[7] = local_8[7] + 1;
    std::__cxx11::string::string(local_40);
    local_50 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)in_stack_fffffffffffffcf8);
    __gnu_cxx::
    __normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
    ::__normal_iterator<std::__cxx11::string*>
              ((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *)in_stack_fffffffffffffd00,
               (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *)in_stack_fffffffffffffcf8);
    while( true ) {
      local_58 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)in_stack_fffffffffffffcf8);
      bVar1 = __gnu_cxx::operator!=
                        ((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)in_stack_fffffffffffffd00,
                         (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)in_stack_fffffffffffffcf8);
      if (!bVar1) break;
      pbVar4 = __gnu_cxx::
               __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator*(&local_48);
      std::__cxx11::string::operator+=(local_40,(string *)pbVar4);
      __gnu_cxx::
      __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator++(&local_48);
    }
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1e0);
    poVar5 = std::operator<<(&local_1e0,':');
    uVar6 = parameters::mask(in_stack_fffffffffffffcf8);
    __val = local_18 & uVar6;
    uVar2 = parameters::stride_shift(in_stack_fffffffffffffcf8);
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,__val >> ((byte)uVar2 & 0x3f));
    poVar5 = std::operator<<(poVar5,':');
    pwVar3 = parameters::operator[](in_stack_fffffffffffffd08,(size_t)in_stack_fffffffffffffd00);
    std::ostream::operator<<(poVar5,*pwVar3);
    std::__cxx11::ostringstream::str();
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffffd08,in_stack_fffffffffffffd00);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffffd08,(char)((ulong)in_stack_fffffffffffffd00 >> 0x38));
    std::__cxx11::string::~string(local_220);
    std::__cxx11::string::~string(local_240);
    if (1 < (ulong)local_8[3]) {
      std::__cxx11::to_string(__val);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffffd08,(char)((ulong)in_stack_fffffffffffffd00 >> 0x38));
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffffd08,in_stack_fffffffffffffd00);
      std::__cxx11::string::operator=((string *)local_200,local_260);
      std::__cxx11::string::~string(local_260);
      std::__cxx11::string::~string(local_280);
      std::__cxx11::string::~string(local_2a0);
    }
    this_00 = (io_buf *)local_8[5];
    this = (parameters *)local_200;
    std::__cxx11::string::c_str();
    std::__cxx11::string::size();
    io_buf::bin_write_fixed(this_00,&this->sparse,(size_t)in_stack_fffffffffffffd00);
    pwVar3 = parameters::operator[](this,(size_t)in_stack_fffffffffffffd00);
    *pwVar3 = 0.0;
    std::__cxx11::string::~string((string *)local_200);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1e0);
    std::__cxx11::string::~string(local_40);
  }
  return;
}

Assistant:

inline void audit_regressor_feature(audit_regressor_data& dat, const float, const uint64_t ft_idx)
{
  parameters& weights = dat.all->weights;
  if (weights[ft_idx] != 0)
    ++dat.values_audited;
  else
    return;

  string ns_pre;
  for (vector<string>::const_iterator s = dat.ns_pre->begin(); s != dat.ns_pre->end(); ++s) ns_pre += *s;

  ostringstream tempstream;
  tempstream << ':' << ((ft_idx & weights.mask()) >> weights.stride_shift()) << ':' << weights[ft_idx];

  string temp = ns_pre + tempstream.str() + '\n';
  if (dat.total_class_cnt > 1)  // add class prefix for multiclass problems
    temp = to_string(dat.cur_class) + ':' + temp;

  dat.out_file->bin_write_fixed(temp.c_str(), (uint32_t)temp.size());

  weights[ft_idx] = 0.;  // mark value audited
}